

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# p_pspr.cpp
# Opt level: O0

void __thiscall DPSprite::SetState(DPSprite *this,FState *newstate,bool pending)

{
  APlayerPawn *self;
  bool bVar1;
  int iVar2;
  AActor *stateowner;
  undefined1 local_38 [8];
  FStateParamInfo stp;
  FState *nextstate;
  FState *pFStack_18;
  bool pending_local;
  FState *newstate_local;
  DPSprite *this_local;
  
  if (this->ID == 1) {
    this->Owner->WeaponState = this->Owner->WeaponState & 0xf090;
  }
  this->processPending = pending;
  pFStack_18 = newstate;
  do {
    if (pFStack_18 == (FState *)0x0) {
      (*(this->super_DObject)._vptr_DObject[4])();
      return;
    }
    this->State = pFStack_18;
    if (pFStack_18->sprite != 1) {
      bVar1 = FState::GetSameFrame(pFStack_18);
      if (!bVar1) {
        iVar2 = FState::GetFrame(pFStack_18);
        this->Frame = iVar2;
      }
      if (pFStack_18->sprite != 2) {
        this->Sprite = (uint)pFStack_18->sprite;
      }
    }
    iVar2 = FState::GetTics(pFStack_18);
    this->Tics = iVar2;
    if ((this->Flags & 8U) != 0) {
      iVar2 = FIntCVar::operator_cast_to_int(&sv_fastweapons);
      if ((iVar2 == 2) && (this->ID == 1)) {
        this->Tics = (uint)(pFStack_18->ActionFunc != (VMFunction *)0x0);
      }
      else {
        iVar2 = FIntCVar::operator_cast_to_int(&sv_fastweapons);
        if (iVar2 == 3) {
          iVar2 = FState::GetTics(pFStack_18);
          this->Tics = (uint)(iVar2 != 0);
        }
        else {
          iVar2 = FIntCVar::operator_cast_to_int(&sv_fastweapons);
          if (iVar2 != 0) {
            this->Tics = 1;
          }
        }
      }
    }
    if (this->ID != 1000) {
      iVar2 = FState::GetMisc1(pFStack_18);
      if (iVar2 != 0) {
        iVar2 = FState::GetMisc1(pFStack_18);
        this->x = (double)iVar2;
      }
      iVar2 = FState::GetMisc2(pFStack_18);
      if (iVar2 != 0) {
        iVar2 = FState::GetMisc2(pFStack_18);
        this->y = (double)iVar2;
      }
    }
    if (this->Owner->mo == (APlayerPawn *)0x0) {
LAB_006a489f:
      pFStack_18 = FState::GetNextState(this->State);
    }
    else {
      local_38 = (undefined1  [8])pFStack_18;
      stp.mCallingState._0_4_ = 1;
      stp.mCallingState._4_4_ = this->ID;
      self = this->Owner->mo;
      stateowner = ::TObjPtr::operator_cast_to_AActor_((TObjPtr *)&this->Caller);
      bVar1 = FState::CallAction(pFStack_18,&self->super_AActor,stateowner,
                                 (FStateParamInfo *)local_38,(FState **)&stp.mStateType);
      if (!bVar1) goto LAB_006a489f;
      if (((this->super_DObject).ObjectFlags & 0x20) != 0) {
        return;
      }
      if (stp._8_8_ == 0) {
        if (this->State == (FState *)0x0) {
          (*(this->super_DObject)._vptr_DObject[4])();
          return;
        }
        goto LAB_006a489f;
      }
      pFStack_18 = (FState *)stp._8_8_;
      this->Tics = 0;
    }
    if (this->Tics != 0) {
      return;
    }
  } while( true );
}

Assistant:

void DPSprite::SetState(FState *newstate, bool pending)
{
	if (ID == PSP_WEAPON)
	{ // A_WeaponReady will re-set these as needed
		Owner->WeaponState &= ~(WF_WEAPONREADY | WF_WEAPONREADYALT | WF_WEAPONBOBBING | WF_WEAPONSWITCHOK | WF_WEAPONRELOADOK | WF_WEAPONZOOMOK |
								WF_USER1OK | WF_USER2OK | WF_USER3OK | WF_USER4OK);
	}

	processPending = pending;

	do
	{
		if (newstate == nullptr)
		{ // Object removed itself.
			Destroy();
			return;
		}
		State = newstate;

		if (newstate->sprite != SPR_FIXED)
		{ // okay to change sprite and/or frame
			if (!newstate->GetSameFrame())
			{ // okay to change frame
				Frame = newstate->GetFrame();
			}
			if (newstate->sprite != SPR_NOCHANGE)
			{ // okay to change sprite
				Sprite = newstate->sprite;
			}
		}

		Tics = newstate->GetTics(); // could be 0

		if (Flags & PSPF_CVARFAST)
		{
			if (sv_fastweapons == 2 && ID == PSP_WEAPON)
				Tics = newstate->ActionFunc == nullptr ? 0 : 1;
			else if (sv_fastweapons == 3)
				Tics = (newstate->GetTics() != 0);
			else if (sv_fastweapons)
				Tics = 1;		// great for producing decals :)
		}

		if (ID != PSP_FLASH)
		{ // It's still possible to set the flash layer's offsets with the action function.
			if (newstate->GetMisc1())
			{ // Set coordinates.
				x = newstate->GetMisc1();
			}
			if (newstate->GetMisc2())
			{
				y = newstate->GetMisc2();
			}
		}

		if (Owner->mo != nullptr)
		{
			FState *nextstate;
			FStateParamInfo stp = { newstate, STATE_Psprite, ID };
			if (newstate->CallAction(Owner->mo, Caller, &stp, &nextstate))
			{
				// It's possible this call resulted in this very layer being replaced.
				if (ObjectFlags & OF_EuthanizeMe)
				{
					return;
				}
				if (nextstate != nullptr)
				{
					newstate = nextstate;
					Tics = 0;
					continue;
				}
				if (State == nullptr)
				{
					Destroy();
					return;
				}
			}
		}

		newstate = State->GetNextState();
	} while (!Tics); // An initial state of 0 could cycle through.

	return;
}